

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

undefined8 fmt::v11::vsystem_error(int error_code,string_view fmt,format_args args)

{
  error_code __ec;
  error_category *__cat;
  int in_ESI;
  undefined8 in_RDI;
  error_code ec;
  undefined1 in_stack_000001a0 [16];
  undefined1 in_stack_000001b0 [16];
  string local_78 [32];
  undefined8 in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  string *psVar1;
  system_error *psStack_38;
  
  __cat = (error_category *)std::_V2::generic_category();
  std::error_code::error_code((error_code *)&stack0xffffffffffffffc0,in_ESI,__cat);
  psVar1 = in_stack_ffffffffffffffc0;
  vformat_abi_cxx11_((string_view)in_stack_000001b0,(format_args)in_stack_000001a0);
  __ec._M_cat = (error_category *)psVar1;
  __ec._0_8_ = in_stack_ffffffffffffffb8;
  std::system_error::system_error(psStack_38,__ec,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_78);
  return in_RDI;
}

Assistant:

FMT_FUNC auto vsystem_error(int error_code, string_view fmt, format_args args)
    -> std::system_error {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(fmt, args));
}